

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::stack_rti
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_f [7];
  
  local_f[0] = CycleFetchPCThrowaway;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_f);
    local_f[1] = 2;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_f + 1);
      local_f[2] = 0x15;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_f + 2);
        local_f[3] = 0x15;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_f + 3);
          local_f[4] = 0x15;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_f + 4);
            local_f[5] = 0x16;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_f + 5);
              local_f[6] = 0x2e;
              if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*target->_M_invoker)((_Any_data *)target,local_f + 6);
                return;
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void stack_rti(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchPCThrowaway);		// IO.
		target(CycleFetchPCThrowaway);		// IO.

		target(CyclePull);					// P.
		target(CyclePull);					// New PCL.
		target(CyclePull);					// New PCH.
		target(CyclePullIfNotEmulation);	// PBR.

		target(OperationPerform);			// [RTI] — to unpack the fields above.
	}